

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void pybind11::detail::keep_alive_impl(handle nurse,handle patient)

{
  iterator __position;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *__x;
  internals *piVar1;
  vector<_object*,std::allocator<_object*>> *this;
  undefined1 local_48 [8];
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> tinfo;
  cpp_function disable_lifesupport;
  weakref wr;
  
  if ((nurse.m_ptr != (PyObject *)0x0) && (patient.m_ptr != (PyObject *)0x0)) {
    if (nurse.m_ptr != (PyObject *)&_Py_NoneStruct && patient.m_ptr != (PyObject *)&_Py_NoneStruct)
    {
      __x = all_type_info((nurse.m_ptr)->ob_type);
      std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
      vector((vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              *)local_48,__x);
      disable_lifesupport.super_function.super_object.super_handle.m_ptr =
           (function)(function)patient.m_ptr;
      if (local_48 ==
          (undefined1  [8])
          tinfo.
          super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        cpp_function::
        cpp_function<pybind11::detail::keep_alive_impl(pybind11::handle,pybind11::handle)::_lambda(pybind11::handle)_1_,,void>
                  ((cpp_function *)
                   &tinfo.
                    super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(type *)&disable_lifesupport)
        ;
        weakref::weakref((weakref *)&disable_lifesupport,nurse,
                         (handle)tinfo.
                                 super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
        (patient.m_ptr)->ob_refcnt = (patient.m_ptr)->ob_refcnt + 1;
        disable_lifesupport.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
        object::~object((object *)&disable_lifesupport);
        object::~object((object *)
                        &tinfo.
                         super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        tinfo.
        super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)nurse.m_ptr;
        piVar1 = get_internals();
        *(byte *)(tinfo.
                  super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 6) =
             *(byte *)(tinfo.
                       super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 6) | 0x10;
        *(long *)disable_lifesupport.super_function.super_object.super_handle.m_ptr =
             *(long *)disable_lifesupport.super_function.super_object.super_handle.m_ptr + 1;
        this = (vector<_object*,std::allocator<_object*>> *)
               std::__detail::
               _Map_base<const__object_*,_std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const__object_*>,_std::hash<const__object_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const__object_*,_std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const__object_*>,_std::hash<const__object_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&piVar1->patients,
                            (key_type *)
                            &tinfo.
                             super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __position._M_current = *(_object ***)(this + 8);
        if (__position._M_current == *(_object ***)(this + 0x10)) {
          std::vector<_object*,std::allocator<_object*>>::_M_realloc_insert<_object*const&>
                    (this,__position,(_object **)&disable_lifesupport);
        }
        else {
          *__position._M_current =
               (_object *)disable_lifesupport.super_function.super_object.super_handle.m_ptr;
          *(long *)(this + 8) = *(long *)(this + 8) + 8;
        }
      }
      if (local_48 != (undefined1  [8])0x0) {
        operator_delete((void *)local_48,
                        (long)tinfo.
                              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_48);
      }
    }
    return;
  }
  pybind11_fail("Could not activate keep_alive!");
}

Assistant:

void keep_alive_impl(handle nurse, handle patient) {
    if (!nurse || !patient)
        pybind11_fail("Could not activate keep_alive!");

    if (patient.is_none() || nurse.is_none())
        return; /* Nothing to keep alive or nothing to be kept alive by */

    auto tinfo = all_type_info(Py_TYPE(nurse.ptr()));
    if (!tinfo.empty()) {
        /* It's a pybind-registered type, so we can store the patient in the
         * internal list. */
        add_patient(nurse.ptr(), patient.ptr());
    }
    else {
        /* Fall back to clever approach based on weak references taken from
         * Boost.Python. This is not used for pybind-registered types because
         * the objects can be destroyed out-of-order in a GC pass. */
        cpp_function disable_lifesupport(
            [patient](handle weakref) { patient.dec_ref(); weakref.dec_ref(); });

        weakref wr(nurse, disable_lifesupport);

        patient.inc_ref(); /* reference patient and leak the weak reference */
        (void) wr.release();
    }
}